

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O2

bool dxil_spv::emit_derivative_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TypeID TVar4;
  Id IVar5;
  TypeID TVar6;
  Id IVar7;
  Builder *pBVar8;
  Type *pTVar9;
  Operation *pOVar10;
  Value *pVVar11;
  Operation *pOVar12;
  Operation *pOVar13;
  Operation *this;
  Operation *this_00;
  uint u;
  
  pBVar8 = Converter::Impl::builder(impl);
  if ((impl->execution_mode_meta).synthesize_dummy_derivatives == true) {
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    TVar4 = LLVMBC::Type::getTypeID(pTVar9);
    if ((TVar4 == HalfTyID) &&
       (bVar2 = Converter::Impl::support_native_fp16_operations(impl), bVar2)) {
      IVar5 = spv::Builder::makeFloat16Constant(pBVar8,0,false);
    }
    else {
      IVar5 = spv::Builder::makeFloatConstant(pBVar8,0.0,false);
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar5);
    return true;
  }
  if ((impl->execution_model != ExecutionModelFragment) &&
     ((impl->options).compute_shader_derivatives == false)) {
    if (opcode - OpDPdxFine < 2) {
      emit_expect_assume_quad_uniform(impl);
      pBVar8 = Converter::Impl::builder(impl);
      spv::Builder::addCapability(pBVar8,CapabilityGroupNonUniform);
      spv::Builder::addCapability(pBVar8,CapabilityGroupNonUniformQuad);
      pTVar9 = LLVMBC::Value::getType((Value *)instruction);
      IVar5 = Converter::Impl::get_type_id(impl,pTVar9,0);
      pOVar10 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar5);
      IVar7 = spv::Builder::makeUintConstant(pBVar8,3,false);
      Operation::add_id(pOVar10,IVar7);
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar7 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar10,IVar7);
      u = (uint)(opcode == OpDPdyFine);
      IVar7 = spv::Builder::makeUintConstant(pBVar8,u,false);
      Operation::add_id(pOVar10,IVar7);
      Converter::Impl::add(impl,pOVar10,false);
      pOVar12 = Converter::Impl::allocate(impl,OpFSub,IVar5);
      Operation::add_id(pOVar12,pOVar10->id);
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar7 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar12,IVar7);
      Converter::Impl::add(impl,pOVar12,false);
      pOVar13 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar5);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,3,false);
      Operation::add_id(pOVar13,IVar5);
      Operation::add_id(pOVar13,pOVar12->id);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,u,false);
      Operation::add_id(pOVar13,IVar5);
      Converter::Impl::add(impl,pOVar13,false);
      IVar5 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,BuiltInSubgroupLocalInvocationId);
      IVar7 = spv::Builder::makeUintType(pBVar8,0x20);
      pOVar10 = Converter::Impl::allocate(impl,OpLoad,IVar7);
      Operation::add_id(pOVar10,IVar5);
      Converter::Impl::add(impl,pOVar10,false);
      IVar5 = spv::Builder::makeUintType(pBVar8,0x20);
      this = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar5);
      Operation::add_id(this,pOVar10->id);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,u + 1,false);
      Operation::add_id(this,IVar5);
      Converter::Impl::add(impl,this,false);
      IVar5 = spv::Builder::makeBoolType(pBVar8);
      this_00 = Converter::Impl::allocate(impl,OpINotEqual,IVar5);
      Operation::add_id(this_00,this->id);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,0,false);
      Operation::add_id(this_00,IVar5);
      Converter::Impl::add(impl,this_00,false);
      pOVar10 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
      Operation::add_id(pOVar10,this_00->id);
      Operation::add_id(pOVar10,pOVar13->id);
      Operation::add_id(pOVar10,pOVar12->id);
    }
    else {
      if (1 < opcode - OpDPdxCoarse) {
        return false;
      }
      emit_expect_assume_quad_uniform(impl);
      pBVar8 = Converter::Impl::builder(impl);
      spv::Builder::addCapability(pBVar8,CapabilityGroupNonUniformQuad);
      pTVar9 = LLVMBC::Value::getType((Value *)instruction);
      IVar5 = Converter::Impl::get_type_id(impl,pTVar9,0);
      pOVar12 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar5);
      IVar7 = spv::Builder::makeUintConstant(pBVar8,3,false);
      Operation::add_id(pOVar12,IVar7);
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar7 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar12,IVar7);
      IVar7 = spv::Builder::makeUintConstant(pBVar8,0,false);
      Operation::add_id(pOVar12,IVar7);
      pOVar13 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar5);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,3,false);
      Operation::add_id(pOVar13,IVar5);
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar13,IVar5);
      IVar5 = spv::Builder::makeUintConstant(pBVar8,(opcode == OpDPdyCoarse) + 1,false);
      Operation::add_id(pOVar13,IVar5);
      pOVar10 = Converter::Impl::allocate(impl,OpFSub,(Value *)instruction);
      Operation::add_id(pOVar10,pOVar13->id);
      Operation::add_id(pOVar10,pOVar12->id);
      Converter::Impl::add(impl,pOVar12,false);
      Converter::Impl::add(impl,pOVar13,false);
    }
    Converter::Impl::add(impl,pOVar10,false);
    return true;
  }
  pTVar9 = LLVMBC::Value::getType((Value *)instruction);
  TVar4 = LLVMBC::Type::getTypeID(pTVar9);
  pTVar9 = LLVMBC::Value::getType((Value *)instruction);
  TVar6 = LLVMBC::Type::getTypeID(pTVar9);
  if (TVar6 == HalfTyID) {
    bVar3 = Converter::Impl::support_native_fp16_operations(impl);
    bVar2 = !bVar3;
    bVar1 = bVar2;
    if (TVar4 != FloatTyID && bVar3) {
LAB_0015ac51:
      IVar7 = spv::Builder::makeFloatType(pBVar8,0x20);
      pOVar10 = Converter::Impl::allocate(impl,OpFConvert,IVar7);
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      bVar1 = false;
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar10,IVar5);
      Converter::Impl::add(impl,pOVar10,false);
      IVar5 = pOVar10->id;
      pOVar10 = Converter::Impl::allocate(impl,opcode,IVar7);
      goto LAB_0015acb5;
    }
  }
  else {
    bVar2 = false;
    bVar1 = false;
    if (TVar4 != FloatTyID) goto LAB_0015ac51;
  }
  bVar2 = bVar1;
  pOVar10 = Converter::Impl::allocate(impl,opcode,(Value *)instruction);
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  bVar1 = true;
LAB_0015acb5:
  Operation::add_id(pOVar10,IVar5);
  Converter::Impl::add(impl,pOVar10,false);
  if (bVar2) {
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar9,pOVar10->id,false);
  }
  if (!bVar1) {
    pOVar12 = Converter::Impl::allocate(impl,OpFConvert,(Value *)instruction);
    Operation::add_id(pOVar12,pOVar10->id);
    Converter::Impl::add(impl,pOVar12,false);
  }
  pBVar8 = Converter::Impl::builder(impl);
  spv::Builder::addCapability(pBVar8,CapabilityDerivativeControl);
  return true;
}

Assistant:

bool emit_derivative_instruction(spv::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		spv::Id constant_0;
		if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
		    impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
		}

		impl.rewrite_value(instruction, constant_0);
		return true;
	}

	if (impl.execution_model != spv::ExecutionModelFragment &&
	    !impl.options.compute_shader_derivatives)
	{
		return emit_derivative_instruction_quad(opcode, impl, instruction);
	}

	bool relax_precision = false;
	spv::Id input_id;

	// SPIR-V only supports 32-bit derivatives.
	bool fp32 = instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
	    !impl.support_native_fp16_operations())
	{
		fp32 = true;
		relax_precision = true;
	}

	Operation *op;
	if (fp32)
	{
		op = impl.allocate(opcode, instruction);
		// Somewhat redundant, but avoid changing reference output
		// for all shaders that use derivatives with constants.
		input_id = impl.get_id_for_value(instruction->getOperand(1));
	}
	else
	{
		spv::Id fp32_type = builder.makeFloatType(32);
		auto *cast_op = impl.allocate(spv::OpFConvert, fp32_type);
		cast_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(cast_op);
		input_id = cast_op->id;

		op = impl.allocate(opcode, fp32_type);
	}

	op->add_id(input_id);
	impl.add(op);

	if (relax_precision)
		impl.decorate_relaxed_precision(instruction->getType(), op->id, false);

	if (!fp32)
	{
		auto *cast_op = impl.allocate(spv::OpFConvert, instruction);
		cast_op->add_id(op->id);
		impl.add(cast_op);
	}

	impl.builder().addCapability(spv::CapabilityDerivativeControl);
	return true;
}